

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void rv64gcsu_priv1_10_0_cpu_init(CPUState_conflict *obj)

{
  CPURISCVState_conflict2 *env_00;
  CPURISCVState_conflict2 *env;
  CPUState_conflict *obj_local;
  
  env_00 = (CPURISCVState_conflict2 *)(obj[1].tb_jmp_cache + 0x143);
  set_misa(env_00,0x800000000014112d);
  set_priv_version(env_00,0x11000);
  set_resetvec(env_00,0x1000);
  set_feature(env_00,0);
  set_feature(env_00,1);
  return;
}

Assistant:

static void rv64gcsu_priv1_10_0_cpu_init(CPUState *obj)
{
    CPURISCVState *env = &RISCV_CPU(obj)->env;
    set_misa(env, RV64 | RVI | RVM | RVA | RVF | RVD | RVC | RVS | RVU);
    set_priv_version(env, PRIV_VERSION_1_10_0);
    set_resetvec(env, DEFAULT_RSTVEC);
    set_feature(env, RISCV_FEATURE_MMU);
    set_feature(env, RISCV_FEATURE_PMP);
}